

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test::testBody
          (TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MockActualCall *pMVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SimpleString local_1d0;
  SimpleString local_1c0;
  SimpleString local_1b0;
  SimpleString local_1a0;
  SimpleString local_190;
  SimpleString local_180;
  SimpleString local_170;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test *local_10;
  TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,local_40);
  SimpleString::SimpleString(&local_50,"double");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_50,1.0);
  (*pMVar3->_vptr_MockExpectedCall[9])();
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,&local_70);
  SimpleString::SimpleString(&local_80,"double");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_00,iVar1),&local_80,1.0);
  (*pMVar3->_vptr_MockExpectedCall[9])();
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_b0,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_01,iVar1),&local_b0,1.0);
  SimpleString::SimpleString(&local_c0,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_c0,1);
  SimpleString::SimpleString(&local_d0,"string");
  MockActualCall::withParameter(pMVar4,&local_d0,"string");
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f0,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_f0);
  SimpleString::SimpleString(&local_100,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_02,iVar1),&local_100,1.0);
  SimpleString::SimpleString(&local_110,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_110,1);
  SimpleString::SimpleString(&local_120,"string");
  MockActualCall::withParameter(pMVar4,&local_120,"string");
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_140,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_140);
  SimpleString::SimpleString(&local_150,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_03,iVar1),&local_150,1.0);
  SimpleString::SimpleString(&local_160,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_160,1);
  SimpleString::SimpleString(&local_170,"string");
  MockActualCall::withParameter(pMVar4,&local_170,"string");
  SimpleString::~SimpleString(&local_170);
  SimpleString::~SimpleString(&local_160);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_180,"");
  pMVar2 = mock(&local_180,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_190,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_190);
  SimpleString::SimpleString(&local_1a0,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_04,iVar1),&local_1a0,1.0);
  SimpleString::SimpleString(&local_1b0,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_1b0,1);
  SimpleString::SimpleString(&local_1c0,"string");
  MockActualCall::withParameter(pMVar4,&local_1c0,"string");
  SimpleString::~SimpleString(&local_1c0);
  SimpleString::~SimpleString(&local_1b0);
  SimpleString::~SimpleString(&local_1a0);
  SimpleString::~SimpleString(&local_190);
  SimpleString::~SimpleString(&local_180);
  SimpleString::SimpleString(&local_1d0,"");
  pMVar2 = mock(&local_1d0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_1d0);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleMultipleCallsWithParameters)
{
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");

    mock().checkExpectations();
}